

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_6,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  int row;
  long lVar3;
  bool bVar4;
  float *pfVar5;
  long lVar6;
  float fVar7;
  Mat2x3 m;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Matrix<float,_3,_2> local_a8;
  float local_90 [4];
  float local_80 [4];
  float local_70 [2];
  ulong local_68;
  undefined4 local_60;
  Matrix<float,_2,_4> local_58;
  float local_38 [6];
  float afStack_20 [3];
  float afStack_14 [3];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      fVar7 = 1.0;
      if (lVar3 != 0) {
        fVar7 = 0.0;
      }
      local_a8.m_data.m_data[0].m_data[lVar3] = fVar7;
      fVar7 = 1.0;
      if (lVar3 != 1) {
        fVar7 = 0.0;
      }
      local_90[lVar3 + -3] = fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_a8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_a8.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_a8.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_a8.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    local_a8.m_data.m_data[0].m_data[0] = 0.0;
    local_a8.m_data.m_data[0].m_data[1] = 0.0;
    local_a8.m_data.m_data[0].m_data[2] = 0.0;
    local_a8.m_data.m_data[1].m_data[0] = 0.0;
    local_a8.m_data.m_data[1].m_data[1] = 0.0;
    local_a8.m_data.m_data[1].m_data[2] = 0.0;
    lVar3 = 0;
    do {
      fVar7 = (float)(&DAT_00ae3c74)[lVar3 * 2];
      local_a8.m_data.m_data[0].m_data[lVar3] = (float)(&s_constInMat2x3)[lVar3 * 2];
      local_90[lVar3 + -3] = fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  pfVar1 = local_58.m_data.m_data[0].m_data + 1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    pfVar5 = (float *)&local_58;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      lVar6 = 0;
      do {
        fVar7 = 1.0;
        if (lVar3 != lVar6) {
          fVar7 = 0.0;
        }
        pfVar5[lVar6 * 2] = fVar7;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar3 = 1;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar4);
    local_58.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_58.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_58.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    local_58.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    local_58.m_data.m_data[2].m_data[0] = 0.0;
    local_58.m_data.m_data[2].m_data[1] = 0.0;
    local_58.m_data.m_data[3].m_data[0] = 0.0;
    local_58.m_data.m_data[3].m_data[1] = 0.0;
    local_58.m_data.m_data[0].m_data[0] = 0.0;
    local_58.m_data.m_data[0].m_data[1] = 0.0;
    local_58.m_data.m_data[1].m_data[0] = 0.0;
    local_58.m_data.m_data[1].m_data[1] = 0.0;
    lVar3 = 0;
    pfVar5 = (float *)&local_58;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      lVar6 = 0;
      do {
        pfVar5[lVar6 * 2] = *(float *)((long)&DAT_00ae3de0 + lVar6 * 4 + lVar3);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar3 = 0x10;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar4);
  }
  tcu::operator*(&local_a8,&local_58);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar3 = 0;
  do {
    local_80[lVar3] = local_38[lVar3] + local_38[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_68 = local_68 & 0xffffffff00000000;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar3 = 0;
  do {
    local_70[lVar3] = local_80[lVar3] + local_38[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar3 = 0;
  do {
    local_90[lVar3] = local_70[lVar3] + local_38[lVar3 + 9];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_68 = 0x100000000;
  local_60 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_70[lVar3]] = local_90[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}